

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_tobin.c
# Opt level: O1

int cfg_tobin_int(void *reference,size_t bin_size,const_strarray *value,uint16_t fraction,
                 size_t int_size)

{
  int iVar1;
  uint64_t scaling;
  ulong uVar2;
  int iVar3;
  int64_t i;
  undefined4 local_20;
  undefined4 uStack_1c;
  
  iVar3 = -1;
  if (bin_size == int_size) {
    if (fraction == 0) {
      scaling = 1;
    }
    else {
      uVar2 = (ulong)fraction;
      scaling = 1;
      do {
        scaling = scaling * 10;
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
    iVar1 = isonumber_to_s64((int64_t *)&local_20,value->value,scaling);
    iVar3 = iVar1;
    if (iVar1 == 0) {
      if (int_size == 8) {
        *(ulong *)reference = CONCAT44(uStack_1c,local_20);
      }
      else {
        iVar3 = -1;
        if (int_size == 4) {
          *(undefined4 *)reference = local_20;
          iVar3 = iVar1;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int
cfg_tobin_int(void *reference, size_t bin_size, const struct const_strarray *value, uint16_t fraction, size_t int_size) {
  int64_t i;
  int result;
  uint64_t j, scaling;

  if (bin_size != int_size) {
    return -1;
  }

  for (j = 0, scaling = 1; j < fraction; j++, scaling*=10);

  result = isonumber_to_s64(&i, strarray_get_first_c(value), scaling);
  if (result == 0) {
    switch (int_size) {
      case 4:
        *((int32_t *)reference) = i;
        break;
      case 8:
        *((int64_t *)reference) = i;
        break;
      default:
        return -1;
    }
  }
  return result;
}